

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O1

void __thiscall Selector::fillPollFds(Selector *this,pollfd *fds,int *numFds)

{
  Node *pNVar1;
  Node *pNVar2;
  ListenerNode *pLVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  AutoLock m;
  AutoLock local_30;
  
  AutoLock::AutoLock(&local_30,&this->mLock);
  fds->fd = this->mPipe[0];
  fds->events = 1;
  pNVar1 = (this->mList).mTail;
  pNVar2 = ((this->mList).mHead)->next;
  uVar5 = 1;
  do {
    bVar4 = pNVar2 == pNVar1;
    if (bVar4) {
LAB_0011e4ab:
      if (bVar4) {
        *numFds = uVar5;
      }
      AutoLock::~AutoLock(&local_30);
      return;
    }
    uVar7 = 1;
    if (1 < (int)uVar5) {
      uVar7 = (ulong)uVar5;
      uVar6 = 1;
      do {
        if (fds[uVar6].fd == pNVar2->val->mFd) {
          fds[uVar6].events = fds[uVar6].events & pNVar2->val->mEvents;
          uVar7 = uVar6;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    if ((uint)uVar7 == uVar5) {
      pLVar3 = pNVar2->val;
      fds[(int)uVar5].fd = pLVar3->mFd;
      fds[(int)uVar5].events = pLVar3->mEvents;
      uVar5 = uVar5 + 1;
      if (uVar5 == 0x40) {
        *numFds = 0x40;
        uVar5 = 0x40;
        goto LAB_0011e4ab;
      }
    }
    if (pNVar2 != (Node *)0x0) {
      pNVar2 = pNVar2->next;
    }
  } while( true );
}

Assistant:

void Selector::fillPollFds( struct pollfd *fds, int &numFds )
{
	AutoLock m( mLock );
	TRACE_BEGIN( LOG_LVL_INFO );

	fds[ 0 ].fd = mPipe[ PIPE_READER ];
	fds[ 0 ].events = POLLIN;

	int j, i = 1;

	for (JetHead::list<ListenerNode*>::iterator listener = mList.begin(); 
		 listener != mList.end(); ++listener)
	{
		// If we already have this fd in our list, skip it
		for ( j = 1; j < i; j++ )
		{
			if ( fds[ j ].fd == (*listener)->mFd )
			{
				fds[ j ].events &= (*listener)->mEvents;
				break;
			}
		}
		
		if ( j == i )
		{
			fds[ i ].fd = (*listener)->mFd;
			fds[ i ].events = (*listener)->mEvents;
			i++;

			if ( i == kMaxPollFds )
			{
				numFds = kMaxPollFds;
				return;
			}
		}
	}
	
	numFds = i;
	
	for ( i = 0; i < numFds; i++ )
	{
		LOG_NOISE( "file entry %d: fd %d events %x", i, fds[ i ].fd, fds[ i ].events );
	}
	
	LOG( "poll on %d fds, size %d", numFds, mList.size() );
}